

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

void __thiscall OpenMD::RectMatrix<double,_6U,_6U>::mul(RectMatrix<double,_6U,_6U> *this,double s)

{
  uint j;
  uint i;
  double s_local;
  RectMatrix<double,_6U,_6U> *this_local;
  
  for (i = 0; i < 6; i = i + 1) {
    for (j = 0; j < 6; j = j + 1) {
      this->data_[i][j] = s * this->data_[i][j];
    }
  }
  return;
}

Assistant:

inline void mul(Real s) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] *= s;
    }